

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void * operator_new__(size_t size)

{
  Sampler *pSVar1;
  byte bVar2;
  ThreadCache *this;
  bool bVar3;
  int iVar4;
  void *in_RAX;
  void *pvVar5;
  sbyte sVar6;
  undefined8 *in_FS_OFFSET;
  void *local_28;
  void *rv;
  
  if ((base::internal::new_hooks_ == 0) &&
     (this = (ThreadCache *)*in_FS_OFFSET, this != (ThreadCache *)0x0)) {
    if (size < 0x401) {
      sVar6 = 3;
      iVar4 = 7;
    }
    else {
      if (0x40000 < size) goto LAB_00112afc;
      sVar6 = 7;
      iVar4 = 0x3c7f;
    }
    bVar2 = (&tcmalloc::Static::sizemap_)[(uint)(iVar4 + (int)size) >> sVar6];
    iVar4 = (&DAT_0012ea44)[bVar2];
    pSVar1 = &this->sampler_;
    pSVar1->bytes_until_sample_ = pSVar1->bytes_until_sample_ - (long)iVar4;
    if (-1 < pSVar1->bytes_until_sample_) {
      local_28 = in_RAX;
      bVar3 = tcmalloc::ThreadCache::FreeList::TryPop(this->list_ + bVar2,&local_28);
      if (bVar3) {
        this->size_ = this->size_ - iVar4;
      }
      else {
        local_28 = tcmalloc::ThreadCache::FetchFromCentralCache
                             (this,(uint)bVar2,iVar4,tcmalloc::cpp_throw_oom);
      }
      return local_28;
    }
    (this->sampler_).bytes_until_sample_ = (this->sampler_).bytes_until_sample_ + (long)iVar4;
  }
LAB_00112afc:
  pvVar5 = tcmalloc::allocate_full_cpp_throw_oom(size);
  return pvVar5;
}

Assistant:

PERFTOOLS_DLL_DECL CACHELINE_ALIGNED_FN
void* tc_new(size_t size) {
  return malloc_fast_path<tcmalloc::cpp_throw_oom>(size);
}